

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefIsNull(TranslateToFuzzReader *this,Type type)

{
  Type type_00;
  Expression *pEVar1;
  Expression *pEVar2;
  
  if (type.id != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1296,"Expression *wasm::TranslateToFuzzReader::makeRefIsNull(Type)");
  }
  if (((this->wasm->features).features & 0x100) != 0) {
    type_00 = getReferenceType(this);
    pEVar1 = make(this,type_00);
    pEVar2 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
    pEVar2->_id = RefIsNullId;
    (pEVar2->type).id = 0;
    *(Expression **)(pEVar2 + 1) = pEVar1;
    wasm::RefIsNull::finalize();
    return pEVar2;
  }
  __assert_fail("wasm.features.hasReferenceTypes()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1297,"Expression *wasm::TranslateToFuzzReader::makeRefIsNull(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeRefIsNull(Type type) {
  assert(type == Type::i32);
  assert(wasm.features.hasReferenceTypes());
  return builder.makeRefIsNull(make(getReferenceType()));
}